

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

void __thiscall
gmlc::networking::TcpAcceptor::logger(TcpAcceptor *this,int logLevel,string *message)

{
  char *pcVar1;
  ostream *poVar2;
  char local_d;
  int local_c;
  
  if ((this->logFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
    pcVar1 = (message->_M_dataplus)._M_p;
    if (logLevel == 0) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pcVar1,message->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      return;
    }
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,pcVar1,message->_M_string_length);
    local_d = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_d,1);
  }
  else {
    local_c = logLevel;
    (*(this->logFunction)._M_invoker)((_Any_data *)&this->logFunction,&local_c,message);
  }
  return;
}

Assistant:

void TcpAcceptor::logger(int logLevel, const std::string& message)
{
    if (logFunction) {
        logFunction(logLevel, message);
    } else {
        if (logLevel == 0) {
            std::cerr << message << std::endl;
        } else {
            std::cout << message << '\n';
        }
    }
}